

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

ggml_backend_graph_plan_t
ggml_backend_cpu_graph_plan_create(ggml_backend_t backend,ggml_cgraph *cgraph)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ggml_tensor **ppgVar4;
  ggml_tensor **ppgVar5;
  ggml_tensor **ppgVar6;
  ggml_tensor **ppgVar7;
  ulong uVar8;
  ggml_bitset_t *pgVar9;
  ggml_tensor **ppgVar10;
  ggml_tensor **ppgVar11;
  ggml_tensor **ppgVar12;
  ulong uVar13;
  ggml_bitset_t *pgVar14;
  ggml_tensor **ppgVar15;
  ulong uVar16;
  ulong *puVar17;
  void *pvVar18;
  ggml_cplan local_50;
  
  piVar1 = (int *)backend->context;
  puVar17 = (ulong *)operator_new(0x80);
  ggml_graph_plan(&local_50,cgraph,*piVar1,*(ggml_threadpool **)(piVar1 + 2));
  puVar17[2] = local_50._16_8_;
  puVar17[3] = (ulong)local_50.threadpool;
  puVar17[4] = (ulong)local_50.abort_callback;
  puVar17[5] = (ulong)local_50.abort_callback_data;
  *puVar17 = local_50.work_size;
  puVar17[1] = (ulong)local_50.work_data;
  puVar17[2] = local_50._16_8_;
  puVar17[3] = (ulong)local_50.threadpool;
  uVar2 = *(ulong *)cgraph;
  uVar3 = *(ulong *)&cgraph->n_leafs;
  ppgVar4 = cgraph->nodes;
  ppgVar5 = cgraph->grads;
  ppgVar6 = cgraph->grad_accs;
  ppgVar7 = cgraph->leafs;
  uVar8 = (cgraph->visited_hash_set).size;
  pgVar9 = (cgraph->visited_hash_set).used;
  ppgVar10 = cgraph->grads;
  ppgVar11 = cgraph->grad_accs;
  ppgVar12 = cgraph->leafs;
  uVar13 = (cgraph->visited_hash_set).size;
  pgVar14 = (cgraph->visited_hash_set).used;
  ppgVar15 = (cgraph->visited_hash_set).keys;
  uVar16 = *(ulong *)&cgraph->order;
  puVar17[8] = (ulong)cgraph->nodes;
  puVar17[9] = (ulong)ppgVar10;
  puVar17[10] = (ulong)ppgVar11;
  puVar17[0xb] = (ulong)ppgVar12;
  puVar17[0xc] = uVar13;
  puVar17[0xd] = (ulong)pgVar14;
  puVar17[0xe] = (ulong)ppgVar15;
  puVar17[0xf] = uVar16;
  puVar17[6] = uVar2;
  puVar17[7] = uVar3;
  puVar17[8] = (ulong)ppgVar4;
  puVar17[9] = (ulong)ppgVar5;
  puVar17[10] = (ulong)ppgVar6;
  puVar17[0xb] = (ulong)ppgVar7;
  puVar17[0xc] = uVar8;
  puVar17[0xd] = (ulong)pgVar9;
  if (*puVar17 != 0) {
    pvVar18 = operator_new__(*puVar17);
    puVar17[1] = (ulong)pvVar18;
  }
  uVar2 = *(ulong *)(piVar1 + 10);
  puVar17[4] = *(ulong *)(piVar1 + 8);
  puVar17[5] = uVar2;
  return puVar17;
}

Assistant:

static ggml_backend_graph_plan_t ggml_backend_cpu_graph_plan_create(ggml_backend_t backend, const struct ggml_cgraph * cgraph) {
    struct ggml_backend_cpu_context * cpu_ctx = (struct ggml_backend_cpu_context *)backend->context;

    struct ggml_backend_plan_cpu * cpu_plan = new ggml_backend_plan_cpu;

    cpu_plan->cplan = ggml_graph_plan(cgraph, cpu_ctx->n_threads, cpu_ctx->threadpool);
    cpu_plan->cgraph = *cgraph; // FIXME: deep copy

    if (cpu_plan->cplan.work_size > 0) {
        cpu_plan->cplan.work_data = new uint8_t[cpu_plan->cplan.work_size];
        if (cpu_plan->cplan.work_data == NULL) {
            delete cpu_plan;
            return NULL;
        }
    }

    cpu_plan->cplan.abort_callback      = cpu_ctx->abort_callback;
    cpu_plan->cplan.abort_callback_data = cpu_ctx->abort_callback_data;

    return cpu_plan;
}